

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O2

ON_SubDComponentRef *
ON_SubDComponentRef::Create
          (ON_SubDComponentRef *__return_storage_ptr__,ON_SubDRef *subd_ref,
          ON_SubDComponentPtr component_ptr,ON_SubDComponentLocation component_location,
          ON__UINT_PTR reference_id)

{
  int iVar1;
  Type TVar2;
  bool bVar3;
  ON_SubDComponentPtr component_ptr_local;
  ON_SubDComponentRef component_ref;
  
  component_ptr_local = component_ptr;
  ON_SubDComponentRef(&component_ref);
  ON_SubDRef::operator=(&component_ref.m_subd_ref,subd_ref);
  component_ref.m_reference_id = reference_id;
  TVar2 = ON_SubDComponentPtr::ComponentType(&component_ptr_local);
  if (TVar2 == Vertex) {
    if (((component_ptr_local.m_ptr & 0xfffffffffffffff8) != 0) &&
       (iVar1 = *(int *)((component_ptr_local.m_ptr & 0xfffffffffffffff8) + 8), 1 < iVar1 + 1U)) {
      component_ref.m_component_ptr = component_ptr_local;
      ON_COMPONENT_INDEX::Set(&component_ref.m_component_index,subd_vertex,iVar1);
      component_ref.m_component_location = component_location;
      goto LAB_00628106;
    }
  }
  else if (TVar2 == Edge) {
    if (((component_ptr_local.m_ptr & 0xfffffffffffffff8) != 0) &&
       (iVar1 = *(int *)((component_ptr_local.m_ptr & 0xfffffffffffffff8) + 8), 1 < iVar1 + 1U)) {
      component_ref.m_component_ptr = component_ptr_local;
      ON_COMPONENT_INDEX::Set(&component_ref.m_component_index,subd_edge,iVar1);
      component_ref.m_component_location = component_location;
      goto LAB_00628106;
    }
  }
  else if (TVar2 == Face) {
    if (((component_ptr_local.m_ptr & 0xfffffffffffffff8) != 0) &&
       (iVar1 = *(int *)((component_ptr_local.m_ptr & 0xfffffffffffffff8) + 8), 1 < iVar1 + 1U)) {
      component_ref.m_component_ptr = component_ptr_local;
      ON_COMPONENT_INDEX::Set(&component_ref.m_component_index,subd_face,iVar1);
      component_ref.m_component_location = component_location;
      goto LAB_00628106;
    }
  }
  else {
    bVar3 = ON_SubDComponentPtr::IsNull(&component_ptr_local);
    if (bVar3) goto LAB_00628106;
  }
  ON_SubDIncrementErrorCount();
LAB_00628106:
  ON_SubDComponentRef(__return_storage_ptr__,&component_ref);
  ~ON_SubDComponentRef(&component_ref);
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDComponentRef ON_SubDComponentRef::Create(
  const ON_SubDRef& subd_ref,
  ON_SubDComponentPtr component_ptr,
  ON_SubDComponentLocation component_location,
  ON__UINT_PTR reference_id
  )
{
  ON_SubDComponentRef component_ref;
  component_ref.m_subd_ref = subd_ref;
  component_ref.m_reference_id = reference_id;
  bool bValidInput = false;
  switch (component_ptr.ComponentType())
  {
  case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = ON_SUBD_VERTEX_POINTER(component_ptr.m_ptr);
      if (nullptr != vertex && vertex->m_id > 0 && vertex->m_id < ON_UNSET_UINT_INDEX)
      {
        component_ref.m_component_ptr = component_ptr;
        component_ref.m_component_index.Set(ON_COMPONENT_INDEX::TYPE::subd_vertex,(int)vertex->m_id);
        component_ref.m_component_location = component_location;
        bValidInput = true;
      }
    }
    break;
  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(component_ptr.m_ptr);
      if (nullptr != edge && edge->m_id > 0 && edge->m_id < ON_UNSET_UINT_INDEX)
      {
        component_ref.m_component_ptr = component_ptr;
        component_ref.m_component_index.Set(ON_COMPONENT_INDEX::TYPE::subd_edge,(int)edge->m_id);
        component_ref.m_component_location = component_location;
        bValidInput = true;
      }
    }
    break;
  case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFace* face = ON_SUBD_FACE_POINTER(component_ptr.m_ptr);
      if (nullptr != face && face->m_id > 0 && face->m_id < ON_UNSET_UINT_INDEX)
      {
        component_ref.m_component_ptr = component_ptr;
        component_ref.m_component_index.Set(ON_COMPONENT_INDEX::TYPE::subd_face,(int)face->m_id);
        component_ref.m_component_location = component_location;
        bValidInput = true;
      }
    }
    break;
  default:
    if ( component_ptr.IsNull() )
      bValidInput = true;
  }

  if (bValidInput)
  {
    return component_ref;
  }

  return ON_SUBD_RETURN_ERROR(component_ref);
}